

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O2

void ossdsp_str(osgen_win_t *win,int y,int x,int color,char *str,size_t len,int *delta_yscroll)

{
  char cVar1;
  int line;
  int iVar2;
  char *msg;
  int iVar3;
  ulong uVar4;
  
  if (delta_yscroll != (int *)0x0) {
    *delta_yscroll = 0;
  }
  do {
    line = y;
    y = line + 1;
    msg = str;
    iVar3 = x;
    while( true ) {
      do {
        if (len == 0) {
          return;
        }
        uVar4 = ((long)win->winx - (long)iVar3) + win->wid;
        if (len <= uVar4) {
          uVar4 = len;
        }
        str = msg + uVar4;
        cVar1 = msg[uVar4];
        msg[uVar4] = '\0';
        ossdsp(line,iVar3,color,msg);
        msg[uVar4] = cVar1;
        len = len - uVar4;
        iVar3 = (int)uVar4 + iVar3;
        x = win->winx;
        iVar2 = (int)win->wid + x;
        msg = str;
      } while (iVar3 < iVar2);
      iVar3 = (int)win->ht + win->winy;
      if ((delta_yscroll == (int *)0x0) || (y < iVar3)) break;
      ossscr(win->winy,x,iVar3 + -1,iVar2 + -1,win->oss_fillcolor);
      win->scrolly = win->scrolly + 1;
      *delta_yscroll = *delta_yscroll + 1;
      iVar3 = x;
    }
  } while( true );
}

Assistant:

static void ossdsp_str(osgen_win_t *win, int y, int x, int color,
                       char *str, size_t len, int *delta_yscroll)
{
    /* presume we won't scroll */
    if (delta_yscroll != 0)
        *delta_yscroll = 0;

    /* keep going until we exhaust the string */
    while (len != 0)
    {
        size_t cur;
        unsigned char oldc;

        /* display as much as will fit on the current line before wrapping */
        cur = win->winx + win->wid - x;
        if (cur > len)
            cur = len;

        /* null-terminate the chunk, but save the original character */
        oldc = str[cur];
        str[cur] = '\0';

        /* display this chunk */
        ossdsp(y, x, color, (char *)str);

        /* restore the character where we put our null */
        str[cur] = oldc;

        /* move our string counters past this chunk */
        str += cur;
        len -= cur;

        /* advance the x position */
        x += cur;

        /* if we've reached the right edge of the window, wrap the line */
        if (x >= win->winx + (int)win->wid)
        {
            /* wrap to the left edge of the window */
            x = win->winx;

            /* advance to the next line */
            ++y;

            /* 
             *   if this puts us past the bottom of the window, and we're
             *   allowed to scroll the window, do so
             */
            if (y >= win->winy + (int)win->ht && delta_yscroll != 0)
            {
                /* scroll by one line */
                ossscr(win->winy, win->winx,
                       win->winy + win->ht - 1, win->winx + win->wid - 1,
                       win->oss_fillcolor);

                /* adjust the scroll position of the window */
                win->scrolly++;

                /* count the scrolling */
                ++(*delta_yscroll);

                /* move back a line */
                --y;
            }
        }
    }
}